

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cc
# Opt level: O1

void __thiscall benchmark::State::SetIterationTime(State *this,double seconds)

{
  TimerManager *this_00;
  char cVar1;
  bool bVar2;
  CheckHandler local_28;
  unique_lock<std::mutex> local_20;
  
  cVar1 = (anonymous_namespace)::running_benchmark;
  if ((anonymous_namespace)::running_benchmark == '\x01') {
    internal::GetNullLogInstance();
  }
  else {
    internal::CheckHandler::CheckHandler
              (&local_28,"running_benchmark",
               "/workspace/llm4binary/github/license_c_cmakelists/jtomschroeder[P]lambda/vendor/benchmark/src/benchmark.cc"
               ,"SetIterationTime",0x3ef);
  }
  this_00 = (anonymous_namespace)::timer_manager;
  if (cVar1 != '\0') {
    local_20._M_device = (mutex_type *)(anonymous_namespace)::timer_manager;
    local_20._M_owns = false;
    std::unique_lock<std::mutex>::lock(&local_20);
    local_20._M_owns = true;
    bVar2 = anon_unknown_1::TimerManager::Barrier(this_00,(MutexLock *)&local_20);
    if (bVar2) {
      this_00->manual_time_used_ = seconds + this_00->manual_time_used_;
      std::unique_lock<std::mutex>::~unique_lock(&local_20);
      std::condition_variable::notify_all();
    }
    else {
      std::unique_lock<std::mutex>::~unique_lock(&local_20);
    }
    return;
  }
  internal::CheckHandler::~CheckHandler(&local_28);
}

Assistant:

void State::SetIterationTime(double seconds)
{
  CHECK(running_benchmark);
  timer_manager->SetIterationTime(seconds);
}